

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatedamagebin.cpp
# Opt level: O0

void __thiscall ValidateDamageBin::CheckFormat(ValidateDamageBin *this)

{
  int iVar1;
  char *pcVar2;
  ValidateDamageBin *this_local;
  
  pcVar2 = fgets((char *)this,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    iVar1 = ScanDeprecatedFormat(this);
    if (iVar1 == 5) {
      fprintf(_stderr,"WARNING: Deprecated format: interval_type column no longer required.\n");
      this->newFormat_ = false;
      (this->super_Validate).warnings_ = true;
      return;
    }
    iVar1 = ScanNewFormat(this);
    if (iVar1 == 4) {
      (this->dbd_).interval_type = 0;
      this->newFormat_ = true;
      return;
    }
    fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
            (ulong)(uint)(this->super_Validate).lineno_);
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  fprintf(_stderr,"ERROR: Empty file\n");
  Validate::PrintErrorMessage(&this->super_Validate);
  return;
}

Assistant:

void ValidateDamageBin::CheckFormat() {

  if (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanDeprecatedFormat() == 5) {

      fprintf(stderr, "WARNING: Deprecated format:"
                      " interval_type column no longer required.\n");
      newFormat_ = false;
      warnings_ = true;
      return;

    } else if (ScanNewFormat() == 4) {

      // Although interval type has been dropped in the new format, it exists
      // in the binary file for backwards compatibility. Therefore, the
      // "missing" interval type from the csv file is set to 0.
      dbd_.interval_type = 0;
      newFormat_ = true;
      return;

    }

    // Could not find valid format
    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  // No line read
  fprintf(stderr, "ERROR: Empty file\n");
  PrintErrorMessage();

}